

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall Assimp::STEP::DB::SetTypesToTrack(DB *this,char **types,size_t N)

{
  char *__s;
  mapped_type *this_00;
  allocator<char> local_79;
  key_type local_78;
  set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  local_58;
  ulong local_28;
  size_t i;
  size_t N_local;
  char **types_local;
  DB *this_local;
  
  i = N;
  N_local = (size_t)types;
  types_local = (char **)this;
  for (local_28 = 0; local_28 < i; local_28 = local_28 + 1) {
    local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_58._M_t._M_impl._0_8_ = 0;
    local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
    ::set(&local_58);
    __s = *(char **)(N_local + local_28 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
              ::operator[](&this->objects_bytype,&local_78);
    std::
    set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
    ::operator=(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::
    set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
    ::~set(&local_58);
  }
  return;
}

Assistant:

void SetTypesToTrack(const char* const* types, size_t N) {
            for(size_t i = 0; i < N;++i) {
                objects_bytype[types[i]] = ObjectSet();
            }
        }